

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcreat.c
# Opt level: O0

MATRIX mat_creat(int row,int col,int type)

{
  MATRIX A_00;
  int in_EDX;
  MATRIX A;
  int in_stack_ffffffffffffffe8;
  undefined8 local_8;
  
  A_00 = _mat_creat(in_EDX,in_stack_ffffffffffffffe8);
  if (A_00 == (MATRIX)0x0) {
    local_8 = (MATRIX)0x0;
  }
  else {
    local_8 = mat_fill(A_00,in_EDX);
  }
  return local_8;
}

Assistant:

MATRIX	_mat_creat( int row, int col )
{
	MATBODY	*mat;
	int 	i;

	if ((mat = (MATBODY *)malloc( sizeof(MATHEAD) + sizeof(double *) * row)) == NULL)
		return (mat_error( MAT_MALLOC ));

	for (i=0; i<row; i++)
	{
	if ((*((double **)(&mat->matrix) + i) = (double *)malloc(sizeof(double) * col)) == NULL)
		return (mat_error( MAT_MALLOC ));
	}

	mat->head.row = row;
	mat->head.col = col;

	return (&(mat->matrix));
}